

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O1

attr * __thiscall Env::findvar(Env *this,string *s)

{
  iterator iVar1;
  Env *e;
  
  do {
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>_>
                    *)this,s);
    if ((_Rb_tree_header *)iVar1._M_node != &(this->var_table)._M_t._M_impl.super__Rb_tree_header) {
      return (attr *)(iVar1._M_node + 2);
    }
    this = this->pre;
  } while (this != (Env *)0x0);
  return (attr *)0x0;
}

Assistant:

struct attr *Env::findvar(const string &s) {
    map<string, attr>::iterator found;
    for (Env *e = this; e != NULL; e = e->pre) {
        found = e->var_table.find(s);
        if (found != e->var_table.end())
            return &(found->second);
    }
    return NULL;
}